

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::AssertionHandler::complete(AssertionHandler *this)

{
  undefined8 uVar1;
  anon_class_1_0_00000001 local_11;
  AssertionHandler *local_10;
  AssertionHandler *this_local;
  
  local_10 = this;
  setCompleted(this);
  if (((this->m_reaction).shouldDebugBreak & 1U) != 0) {
    complete::anon_class_1_0_00000001::operator()(&local_11);
  }
  if (((this->m_reaction).shouldThrow & 1U) != 0) {
    uVar1 = __cxa_allocate_exception(1);
    __cxa_throw(uVar1,&TestFailureException::typeinfo,0);
  }
  return;
}

Assistant:

void AssertionHandler::complete() {
        setCompleted();
        if( m_reaction.shouldDebugBreak ) {

            // If you find your debugger stopping you here then go one level up on the
            // call-stack for the code that caused it (typically a failed assertion)

            // (To go back to the test and change execution, jump over the throw, next)
            CATCH_BREAK_INTO_DEBUGGER();
        }
        if (m_reaction.shouldThrow) {
#if !defined(CATCH_CONFIG_DISABLE_EXCEPTIONS)
            throw Catch::TestFailureException();
#else
            CATCH_ERROR( "Test failure requires aborting test!" );
#endif
        }
    }